

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *
QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::detached
          (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *d)

{
  bool bVar1;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *in_RDI;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *dd;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *local_8;
  
  if (in_RDI == (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0) {
    local_8 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)operator_new(0x28);
    Data(local_8,in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)operator_new(0x28);
    Data(local_8,in_stack_ffffffffffffffd0);
    bVar1 = QtPrivate::RefCount::deref(&local_8->ref);
    if ((!bVar1) && (in_RDI != (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0)) {
      ~Data(in_RDI);
      operator_delete(in_RDI,0x28);
    }
  }
  return local_8;
}

Assistant:

static Data *detached(Data *d)
    {
        if (!d)
            return new Data;
        Data *dd = new Data(*d);
        if (!d->ref.deref())
            delete d;
        return dd;
    }